

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cpp
# Opt level: O0

void __thiscall Model::RegisterPolymer(Model *this,Ptr *polymer)

{
  element_type *this_00;
  shared_ptr<Reaction> local_58 [2];
  shared_ptr<PolymerWrapper> local_38;
  undefined1 local_28 [8];
  shared_ptr<PolymerWrapper> wrapper;
  Ptr *polymer_local;
  Model *this_local;
  
  wrapper.super___shared_ptr<PolymerWrapper,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)polymer;
  std::make_shared<PolymerWrapper,std::shared_ptr<Polymer>&>((shared_ptr<Polymer> *)local_28);
  this_00 = std::__shared_ptr_access<Polymer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                      ((__shared_ptr_access<Polymer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       polymer);
  std::shared_ptr<PolymerWrapper>::shared_ptr(&local_38,(shared_ptr<PolymerWrapper> *)local_28);
  Polymer::wrapper(this_00,&local_38);
  std::shared_ptr<PolymerWrapper>::~shared_ptr(&local_38);
  std::shared_ptr<Reaction>::shared_ptr<PolymerWrapper,void>
            (local_58,(shared_ptr<PolymerWrapper> *)local_28);
  Gillespie::LinkReaction(&this->gillespie_,local_58);
  std::shared_ptr<Reaction>::~shared_ptr(local_58);
  std::shared_ptr<PolymerWrapper>::~shared_ptr((shared_ptr<PolymerWrapper> *)local_28);
  return;
}

Assistant:

void Model::RegisterPolymer(Polymer::Ptr polymer) {
  // Encapsulate polymer in PolymerWrapper reaction and add to reaction list
  auto wrapper = std::make_shared<PolymerWrapper>(polymer);
  polymer->wrapper(wrapper);
  gillespie_.LinkReaction(wrapper);
}